

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

int KYBER_parse_private_key(KYBER_private_key *out_private_key,CBS *in)

{
  int iVar1;
  vector *out;
  uint8_t *in_00;
  size_t sVar2;
  undefined1 local_38 [8];
  CBS s_bytes;
  private_key *priv;
  CBS *in_local;
  KYBER_private_key *out_private_key_local;
  
  s_bytes.len = (size_t)anon_unknown.dwarf_2205c3::private_key_from_external(out_private_key);
  iVar1 = CBS_get_bytes(in,(CBS *)local_38,0x480);
  if (iVar1 != 0) {
    out = (vector *)(s_bytes.len + 0x1840);
    in_00 = CBS_data((CBS *)local_38);
    iVar1 = vector_decode(out,in_00,0xc);
    if ((((iVar1 != 0) &&
         (iVar1 = kyber_parse_public_key_no_hash((public_key *)s_bytes.len,in), iVar1 != 0)) &&
        (iVar1 = CBS_copy_bytes(in,(uint8_t *)(s_bytes.len + 0x620),0x20), iVar1 != 0)) &&
       ((iVar1 = CBS_copy_bytes(in,(uint8_t *)(s_bytes.len + 0x1e40),0x20), iVar1 != 0 &&
        (sVar2 = CBS_len(in), sVar2 == 0)))) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int KYBER_parse_private_key(struct KYBER_private_key *out_private_key,
                            CBS *in) {
  struct private_key *const priv = private_key_from_external(out_private_key);

  CBS s_bytes;
  if (!CBS_get_bytes(in, &s_bytes, kEncodedVectorSize) ||
      !vector_decode(&priv->s, CBS_data(&s_bytes), kLog2Prime) ||
      !kyber_parse_public_key_no_hash(&priv->pub, in) ||
      !CBS_copy_bytes(in, priv->pub.public_key_hash,
                      sizeof(priv->pub.public_key_hash)) ||
      !CBS_copy_bytes(in, priv->fo_failure_secret,
                      sizeof(priv->fo_failure_secret)) ||
      CBS_len(in) != 0) {
    return 0;
  }
  return 1;
}